

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::RenderStairs<ImPlot::GetterYs<double>,ImPlot::TransformerLogLog>
               (GetterYs<double> *getter,TransformerLogLog *transformer,ImDrawList *DrawList,
               float line_weight,ImU32 col)

{
  float *pfVar1;
  double dVar2;
  ImVec2 IVar3;
  ImPlotPlot *pIVar4;
  double dVar5;
  ImPlotContext *pIVar6;
  ImPlotContext *pIVar7;
  ImDrawList *this;
  int iVar8;
  int iVar9;
  ImPlotContext *gp;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  ImVec2 p12;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  double local_78;
  undefined8 uStack_70;
  ImDrawList *local_68;
  ImVec2 local_60;
  undefined1 local_58 [8];
  TransformerLogLog *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar6 = GImPlot;
  pIVar4 = GImPlot->CurrentPlot;
  local_68 = DrawList;
  if (((pIVar4->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true)) {
    iVar8 = getter->Count;
    local_48 = iVar8 + -1;
    local_40 = line_weight * 0.5;
    dVar2 = *(double *)
             ((long)getter->Ys +
             (long)((getter->Offset % iVar8 + iVar8) % iVar8) * (long)getter->Stride);
    local_58 = (undefined1  [8])getter;
    local_50 = transformer;
    local_44 = col;
    dVar5 = log10((getter->XScale * 0.0 + getter->X0) / (pIVar4->XAxis).Range.Min);
    pIVar4 = pIVar6->CurrentPlot;
    local_98._8_4_ = extraout_XMM0_Dc_01;
    local_98._0_8_ = dVar5;
    local_98._12_4_ = extraout_XMM0_Dd_01;
    local_88._8_8_ = 0;
    local_88._0_8_ = pIVar6->LogDenX;
    dVar5 = (pIVar4->XAxis).Range.Min;
    local_78 = (pIVar4->XAxis).Range.Max;
    uStack_70 = 0;
    dVar2 = log10(dVar2 / pIVar4->YAxis[transformer->YAxis].Range.Min);
    iVar8 = transformer->YAxis;
    pIVar4 = pIVar6->CurrentPlot;
    auVar12._8_8_ = dVar2;
    auVar12._0_8_ = local_98._0_8_;
    auVar15._8_8_ = pIVar6->LogDenY[iVar8];
    auVar15._0_8_ = local_88._0_8_;
    auVar10 = divpd(auVar12,auVar15);
    dVar2 = pIVar4->YAxis[iVar8].Range.Min;
    IVar3 = pIVar6->PixelRange[iVar8].Min;
    local_3c.y = (float)(pIVar6->My[iVar8] *
                         (((double)(float)auVar10._8_8_ * (pIVar4->YAxis[iVar8].Range.Max - dVar2) +
                          dVar2) - dVar2) + (double)IVar3.y);
    local_3c.x = (float)(pIVar6->Mx *
                         (((double)(float)auVar10._0_8_ * (local_78 - dVar5) + dVar5) -
                         (pIVar4->XAxis).Range.Min) + (double)IVar3.x);
    RenderPrimitives<ImPlot::StairsRenderer<ImPlot::GetterYs<double>,ImPlot::TransformerLogLog>>
              ((StairsRenderer<ImPlot::GetterYs<double>,_ImPlot::TransformerLogLog> *)local_58,
               local_68,&pIVar4->PlotRect);
  }
  else {
    iVar8 = getter->Count;
    dVar2 = *(double *)
             ((long)getter->Ys +
             (long)((getter->Offset % iVar8 + iVar8) % iVar8) * (long)getter->Stride);
    dVar5 = log10((getter->XScale * 0.0 + getter->X0) / (pIVar4->XAxis).Range.Min);
    pIVar4 = pIVar6->CurrentPlot;
    local_88._8_4_ = extraout_XMM0_Dc;
    local_88._0_8_ = dVar5;
    local_88._12_4_ = extraout_XMM0_Dd;
    local_98._8_8_ = 0;
    local_98._0_8_ = pIVar6->LogDenX;
    dVar5 = (pIVar4->XAxis).Range.Min;
    local_78 = (pIVar4->XAxis).Range.Max;
    uStack_70 = 0;
    dVar2 = log10(dVar2 / pIVar4->YAxis[transformer->YAxis].Range.Min);
    iVar8 = transformer->YAxis;
    pIVar4 = pIVar6->CurrentPlot;
    auVar13._8_8_ = pIVar6->LogDenY[iVar8];
    auVar13._0_8_ = local_98._0_8_;
    auVar10._8_8_ = dVar2;
    auVar10._0_8_ = local_88._0_8_;
    auVar10 = divpd(auVar10,auVar13);
    dVar2 = pIVar4->YAxis[iVar8].Range.Min;
    IVar3 = pIVar6->PixelRange[iVar8].Min;
    local_58._4_4_ =
         (float)(pIVar6->My[iVar8] *
                 (((double)(float)auVar10._8_8_ * (pIVar4->YAxis[iVar8].Range.Max - dVar2) + dVar2)
                 - dVar2) + (double)IVar3.y);
    local_58._0_4_ =
         (float)(pIVar6->Mx *
                 (((double)(float)auVar10._0_8_ * (local_78 - dVar5) + dVar5) -
                 (pIVar4->XAxis).Range.Min) + (double)IVar3.x);
    iVar8 = getter->Count;
    if (1 < iVar8) {
      iVar9 = 1;
      do {
        pIVar7 = GImPlot;
        dVar2 = *(double *)
                 ((long)getter->Ys +
                 (long)(((getter->Offset + iVar9) % iVar8 + iVar8) % iVar8) * (long)getter->Stride);
        dVar5 = log10(((double)iVar9 * getter->XScale + getter->X0) /
                      (GImPlot->CurrentPlot->XAxis).Range.Min);
        pIVar4 = pIVar7->CurrentPlot;
        local_98._8_4_ = extraout_XMM0_Dc_00;
        local_98._0_8_ = dVar5;
        local_98._12_4_ = extraout_XMM0_Dd_00;
        local_88._8_8_ = 0;
        local_88._0_8_ = pIVar7->LogDenX;
        dVar5 = (pIVar4->XAxis).Range.Min;
        local_78 = (pIVar4->XAxis).Range.Max;
        uStack_70 = 0;
        dVar2 = log10(dVar2 / pIVar4->YAxis[transformer->YAxis].Range.Min);
        this = local_68;
        iVar8 = transformer->YAxis;
        pIVar4 = pIVar7->CurrentPlot;
        auVar11._8_8_ = dVar2;
        auVar11._0_8_ = local_98._0_8_;
        auVar14._8_8_ = pIVar7->LogDenY[iVar8];
        auVar14._0_8_ = local_88._0_8_;
        auVar10 = divpd(auVar11,auVar14);
        dVar2 = pIVar4->YAxis[iVar8].Range.Min;
        IVar3 = pIVar7->PixelRange[iVar8].Min;
        local_60.x = (float)(pIVar7->Mx *
                             (((double)(float)auVar10._0_8_ * (local_78 - dVar5) + dVar5) -
                             (pIVar4->XAxis).Range.Min) + (double)IVar3.x);
        local_60.y = (float)(pIVar7->My[iVar8] *
                             (((double)(float)auVar10._8_8_ *
                               (pIVar4->YAxis[iVar8].Range.Max - dVar2) + dVar2) - dVar2) +
                            (double)IVar3.y);
        pIVar4 = pIVar6->CurrentPlot;
        fVar16 = (float)local_58._4_4_;
        if (local_60.y <= (float)local_58._4_4_) {
          fVar16 = local_60.y;
        }
        if ((fVar16 < (pIVar4->PlotRect).Max.y) &&
           (fVar16 = (float)(~-(uint)(local_60.y <= (float)local_58._4_4_) & (uint)local_60.y |
                            -(uint)(local_60.y <= (float)local_58._4_4_) & local_58._4_4_),
           pfVar1 = &(pIVar4->PlotRect).Min.y, *pfVar1 <= fVar16 && fVar16 != *pfVar1)) {
          fVar16 = (float)local_58._0_4_;
          if (local_60.x <= (float)local_58._0_4_) {
            fVar16 = local_60.x;
          }
          if ((fVar16 < (pIVar4->PlotRect).Max.x) &&
             (fVar16 = (float)(-(uint)(local_60.x <= (float)local_58._0_4_) & local_58._0_4_ |
                              ~-(uint)(local_60.x <= (float)local_58._0_4_) & (uint)local_60.x),
             (pIVar4->PlotRect).Min.x <= fVar16 && fVar16 != (pIVar4->PlotRect).Min.x)) {
            local_a0.y = (float)local_58._4_4_;
            local_a0.x = local_60.x;
            ImDrawList::AddLine(local_68,(ImVec2 *)local_58,&local_a0,col,line_weight);
            ImDrawList::AddLine(this,&local_a0,&local_60,col,line_weight);
          }
        }
        iVar9 = iVar9 + 1;
        iVar8 = getter->Count;
        local_58 = (undefined1  [8])local_60;
      } while (iVar9 < iVar8);
    }
  }
  return;
}

Assistant:

inline void RenderStairs(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2)))) {
                ImVec2 p12(p2.x, p1.y);
                DrawList.AddLine(p1, p12, col, line_weight);
                DrawList.AddLine(p12, p2, col, line_weight);
            }
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(StairsRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}